

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O1

void __thiscall embree::Application::Application(Application *this,int features)

{
  _Rb_tree_header *p_Var1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
  *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  atomic<unsigned_long> *paVar4;
  double dVar5;
  CommandLineParser *this_01;
  CommandLineOption *pCVar6;
  mapped_type *pmVar7;
  runtime_error *this_02;
  Ref<embree::CommandLineParser::CommandLineOption> closure;
  value_type local_a8;
  undefined1 *local_a0;
  long local_98;
  undefined1 local_90 [16];
  string local_80;
  key_type local_60;
  CommandLineParser *local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  this->_vptr_Application = (_func_int **)&PTR__Application_002c4cc8;
  local_38 = &(this->rtcore).field_2;
  (this->rtcore)._M_dataplus._M_p = (pointer)local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->rtcore,"");
  this->verbosity = 0;
  this->features = features;
  local_40 = &this->commandLineParser;
  (this->commandLineParser).commandLineOptionList.
  super__Vector_base<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->commandLineParser).commandLineOptionList.
  super__Vector_base<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->commandLineParser).commandLineOptionList.
  super__Vector_base<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->commandLineParser).commandLineOptionMap._M_t._M_impl.super__Rb_tree_header;
  (this->commandLineParser).commandLineOptionMap._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_color = _S_red;
  (this->commandLineParser).commandLineOptionMap._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = (_Base_ptr)0x0;
  (this->commandLineParser).commandLineOptionMap._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_left = &p_Var1->_M_header;
  (this->commandLineParser).commandLineOptionMap._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_right = &p_Var1->_M_header;
  (this->commandLineParser).commandLineOptionMap._M_t._M_impl.super__Rb_tree_header._M_node_count =
       0;
  (this->commandLineParser).verbosity = NORMAL;
  this->log_delta = false;
  dVar5 = getSeconds();
  this->start_time = dVar5;
  this->last_time = dVar5;
  this->last_virtual_memory = 0;
  this->last_resident_memory = 0;
  if (instance == (Application *)0x0) {
    paVar2 = &local_60.field_2;
    instance = this;
    local_60._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"help","");
    local_a0 = local_90;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a0,"--help: prints help for all supported command line options","");
    pCVar6 = (CommandLineOption *)operator_new(0x38);
    paVar3 = &local_80.field_2;
    local_80._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char*>((string *)&local_80,local_a0,local_a0 + local_98);
    (pCVar6->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
    (pCVar6->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c45d0;
    (pCVar6->description)._M_dataplus._M_p = (pointer)&(pCVar6->description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pCVar6->description,local_80._M_dataplus._M_p,
               local_80._M_dataplus._M_p + local_80._M_string_length);
    (pCVar6->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c4d00;
    pCVar6[1].super_RefCount._vptr_RefCount = (_func_int **)this;
    LOCK();
    paVar4 = &(pCVar6->super_RefCount).refCounter;
    (paVar4->super___atomic_base<unsigned_long>)._M_i =
         (paVar4->super___atomic_base<unsigned_long>)._M_i + 1;
    UNLOCK();
    local_a8.ptr = pCVar6;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar3) {
      operator_delete(local_80._M_dataplus._M_p);
    }
    std::
    vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
    ::push_back(&local_40->commandLineOptionList,&local_a8);
    this_00 = &(this->commandLineParser).commandLineOptionMap;
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
             ::operator[](this_00,&local_60);
    if (local_a8.ptr != (CommandLineOption *)0x0) {
      (*((local_a8.ptr)->super_RefCount)._vptr_RefCount[2])();
    }
    if (pmVar7->ptr != (CommandLineOption *)0x0) {
      (*(pmVar7->ptr->super_RefCount)._vptr_RefCount[3])();
    }
    pmVar7->ptr = local_a8.ptr;
    if (local_a8.ptr != (CommandLineOption *)0x0) {
      (*((local_a8.ptr)->super_RefCount)._vptr_RefCount[3])();
    }
    if (local_a0 != local_90) {
      operator_delete(local_a0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    if ((features & 1U) != 0) {
      local_60._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"rtcore","");
      this_01 = local_40;
      local_a0 = local_90;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,"--rtcore <string>: uses <string> to configure Embree device",
                 "");
      pCVar6 = (CommandLineOption *)operator_new(0x38);
      local_80._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char*>((string *)&local_80,local_a0,local_a0 + local_98);
      (pCVar6->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
      (pCVar6->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c45d0;
      (pCVar6->description)._M_dataplus._M_p = (pointer)&(pCVar6->description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pCVar6->description,local_80._M_dataplus._M_p,
                 local_80._M_dataplus._M_p + local_80._M_string_length);
      (pCVar6->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c4d50;
      pCVar6[1].super_RefCount._vptr_RefCount = (_func_int **)this;
      LOCK();
      paVar4 = &(pCVar6->super_RefCount).refCounter;
      (paVar4->super___atomic_base<unsigned_long>)._M_i =
           (paVar4->super___atomic_base<unsigned_long>)._M_i + 1;
      UNLOCK();
      local_a8.ptr = pCVar6;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != paVar3) {
        operator_delete(local_80._M_dataplus._M_p);
      }
      std::
      vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
      ::push_back(&this_01->commandLineOptionList,&local_a8);
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
               ::operator[](this_00,&local_60);
      if (local_a8.ptr != (CommandLineOption *)0x0) {
        (*((local_a8.ptr)->super_RefCount)._vptr_RefCount[2])();
      }
      if (pmVar7->ptr != (CommandLineOption *)0x0) {
        (*(pmVar7->ptr->super_RefCount)._vptr_RefCount[3])();
      }
      pmVar7->ptr = local_a8.ptr;
      if (local_a8.ptr != (CommandLineOption *)0x0) {
        (*((local_a8.ptr)->super_RefCount)._vptr_RefCount[3])();
      }
      if (local_a0 != local_90) {
        operator_delete(local_a0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != paVar2) {
        operator_delete(local_60._M_dataplus._M_p);
      }
      local_60._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"threads","");
      local_a0 = local_90;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,"--threads <int>: number of threads to use","");
      pCVar6 = (CommandLineOption *)operator_new(0x38);
      local_80._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char*>((string *)&local_80,local_a0,local_a0 + local_98);
      (pCVar6->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
      (pCVar6->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c45d0;
      (pCVar6->description)._M_dataplus._M_p = (pointer)&(pCVar6->description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pCVar6->description,local_80._M_dataplus._M_p,
                 local_80._M_dataplus._M_p + local_80._M_string_length);
      (pCVar6->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c4da0;
      pCVar6[1].super_RefCount._vptr_RefCount = (_func_int **)this;
      LOCK();
      paVar4 = &(pCVar6->super_RefCount).refCounter;
      (paVar4->super___atomic_base<unsigned_long>)._M_i =
           (paVar4->super___atomic_base<unsigned_long>)._M_i + 1;
      UNLOCK();
      local_a8.ptr = pCVar6;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != paVar3) {
        operator_delete(local_80._M_dataplus._M_p);
      }
      std::
      vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
      ::push_back(&this_01->commandLineOptionList,&local_a8);
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
               ::operator[](this_00,&local_60);
      if (local_a8.ptr != (CommandLineOption *)0x0) {
        (*((local_a8.ptr)->super_RefCount)._vptr_RefCount[2])();
      }
      if (pmVar7->ptr != (CommandLineOption *)0x0) {
        (*(pmVar7->ptr->super_RefCount)._vptr_RefCount[3])();
      }
      pmVar7->ptr = local_a8.ptr;
      if (local_a8.ptr != (CommandLineOption *)0x0) {
        (*((local_a8.ptr)->super_RefCount)._vptr_RefCount[3])();
      }
      if (local_a0 != local_90) {
        operator_delete(local_a0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != paVar2) {
        operator_delete(local_60._M_dataplus._M_p);
      }
      local_60._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"affinity","");
      local_a0 = local_90;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,"--affinity: affinitize threads","");
      pCVar6 = (CommandLineOption *)operator_new(0x38);
      local_80._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char*>((string *)&local_80,local_a0,local_a0 + local_98);
      (pCVar6->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
      (pCVar6->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c45d0;
      (pCVar6->description)._M_dataplus._M_p = (pointer)&(pCVar6->description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pCVar6->description,local_80._M_dataplus._M_p,
                 local_80._M_dataplus._M_p + local_80._M_string_length);
      (pCVar6->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c4df0;
      pCVar6[1].super_RefCount._vptr_RefCount = (_func_int **)this;
      LOCK();
      paVar4 = &(pCVar6->super_RefCount).refCounter;
      (paVar4->super___atomic_base<unsigned_long>)._M_i =
           (paVar4->super___atomic_base<unsigned_long>)._M_i + 1;
      UNLOCK();
      local_a8.ptr = pCVar6;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != paVar3) {
        operator_delete(local_80._M_dataplus._M_p);
      }
      std::
      vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
      ::push_back(&this_01->commandLineOptionList,&local_a8);
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
               ::operator[](this_00,&local_60);
      if (local_a8.ptr != (CommandLineOption *)0x0) {
        (*((local_a8.ptr)->super_RefCount)._vptr_RefCount[2])();
      }
      if (pmVar7->ptr != (CommandLineOption *)0x0) {
        (*(pmVar7->ptr->super_RefCount)._vptr_RefCount[3])();
      }
      pmVar7->ptr = local_a8.ptr;
      if (local_a8.ptr != (CommandLineOption *)0x0) {
        (*((local_a8.ptr)->super_RefCount)._vptr_RefCount[3])();
      }
      if (local_a0 != local_90) {
        operator_delete(local_a0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != paVar2) {
        operator_delete(local_60._M_dataplus._M_p);
      }
      local_60._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"set_affinity","");
      local_a0 = local_90;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,
                 "--set_affinity <0/1>: enables or disables affinitizing of threads","");
      pCVar6 = (CommandLineOption *)operator_new(0x38);
      local_80._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char*>((string *)&local_80,local_a0,local_a0 + local_98);
      (pCVar6->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
      (pCVar6->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c45d0;
      (pCVar6->description)._M_dataplus._M_p = (pointer)&(pCVar6->description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pCVar6->description,local_80._M_dataplus._M_p,
                 local_80._M_dataplus._M_p + local_80._M_string_length);
      (pCVar6->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c4e40;
      pCVar6[1].super_RefCount._vptr_RefCount = (_func_int **)this;
      LOCK();
      paVar4 = &(pCVar6->super_RefCount).refCounter;
      (paVar4->super___atomic_base<unsigned_long>)._M_i =
           (paVar4->super___atomic_base<unsigned_long>)._M_i + 1;
      UNLOCK();
      local_a8.ptr = pCVar6;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != paVar3) {
        operator_delete(local_80._M_dataplus._M_p);
      }
      std::
      vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
      ::push_back(&this_01->commandLineOptionList,&local_a8);
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
               ::operator[](this_00,&local_60);
      if (local_a8.ptr != (CommandLineOption *)0x0) {
        (*((local_a8.ptr)->super_RefCount)._vptr_RefCount[2])();
      }
      if (pmVar7->ptr != (CommandLineOption *)0x0) {
        (*(pmVar7->ptr->super_RefCount)._vptr_RefCount[3])();
      }
      pmVar7->ptr = local_a8.ptr;
      if (local_a8.ptr != (CommandLineOption *)0x0) {
        (*((local_a8.ptr)->super_RefCount)._vptr_RefCount[3])();
      }
      if (local_a0 != local_90) {
        operator_delete(local_a0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != paVar2) {
        operator_delete(local_60._M_dataplus._M_p);
      }
      local_80._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"set_affinity","");
      local_60._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"set-affinity","");
      CommandLineParser::registerOptionAlias(this_01,&local_80,&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != paVar2) {
        operator_delete(local_60._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != paVar3) {
        operator_delete(local_80._M_dataplus._M_p);
      }
      local_60._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"start_threads","");
      local_a0 = local_90;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,
                 "--start_threads <0/1>: starts threads at device creation time if set to 1","");
      pCVar6 = (CommandLineOption *)operator_new(0x38);
      local_80._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char*>((string *)&local_80,local_a0,local_a0 + local_98);
      (pCVar6->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
      (pCVar6->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c45d0;
      (pCVar6->description)._M_dataplus._M_p = (pointer)&(pCVar6->description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pCVar6->description,local_80._M_dataplus._M_p,
                 local_80._M_dataplus._M_p + local_80._M_string_length);
      (pCVar6->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c4e90;
      pCVar6[1].super_RefCount._vptr_RefCount = (_func_int **)this;
      LOCK();
      paVar4 = &(pCVar6->super_RefCount).refCounter;
      (paVar4->super___atomic_base<unsigned_long>)._M_i =
           (paVar4->super___atomic_base<unsigned_long>)._M_i + 1;
      UNLOCK();
      local_a8.ptr = pCVar6;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != paVar3) {
        operator_delete(local_80._M_dataplus._M_p);
      }
      std::
      vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
      ::push_back(&this_01->commandLineOptionList,&local_a8);
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
               ::operator[](this_00,&local_60);
      if (local_a8.ptr != (CommandLineOption *)0x0) {
        (*((local_a8.ptr)->super_RefCount)._vptr_RefCount[2])();
      }
      if (pmVar7->ptr != (CommandLineOption *)0x0) {
        (*(pmVar7->ptr->super_RefCount)._vptr_RefCount[3])();
      }
      pmVar7->ptr = local_a8.ptr;
      if (local_a8.ptr != (CommandLineOption *)0x0) {
        (*((local_a8.ptr)->super_RefCount)._vptr_RefCount[3])();
      }
      if (local_a0 != local_90) {
        operator_delete(local_a0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != paVar2) {
        operator_delete(local_60._M_dataplus._M_p);
      }
      local_80._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"start_threads","");
      local_60._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"start-threads","");
      CommandLineParser::registerOptionAlias(this_01,&local_80,&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != paVar2) {
        operator_delete(local_60._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != paVar3) {
        operator_delete(local_80._M_dataplus._M_p);
      }
      local_60._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"verbose","");
      local_a0 = local_90;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,"--verbose <int>: sets verbosity level","");
      pCVar6 = (CommandLineOption *)operator_new(0x38);
      local_80._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char*>((string *)&local_80,local_a0,local_a0 + local_98);
      (pCVar6->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
      (pCVar6->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c45d0;
      (pCVar6->description)._M_dataplus._M_p = (pointer)&(pCVar6->description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pCVar6->description,local_80._M_dataplus._M_p,
                 local_80._M_dataplus._M_p + local_80._M_string_length);
      (pCVar6->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c4ee0;
      pCVar6[1].super_RefCount._vptr_RefCount = (_func_int **)this;
      LOCK();
      paVar4 = &(pCVar6->super_RefCount).refCounter;
      (paVar4->super___atomic_base<unsigned_long>)._M_i =
           (paVar4->super___atomic_base<unsigned_long>)._M_i + 1;
      UNLOCK();
      local_a8.ptr = pCVar6;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != paVar3) {
        operator_delete(local_80._M_dataplus._M_p);
      }
      std::
      vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
      ::push_back(&this_01->commandLineOptionList,&local_a8);
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
               ::operator[](this_00,&local_60);
      if (local_a8.ptr != (CommandLineOption *)0x0) {
        (*((local_a8.ptr)->super_RefCount)._vptr_RefCount[2])();
      }
      if (pmVar7->ptr != (CommandLineOption *)0x0) {
        (*(pmVar7->ptr->super_RefCount)._vptr_RefCount[3])();
      }
      pmVar7->ptr = local_a8.ptr;
      if (local_a8.ptr != (CommandLineOption *)0x0) {
        (*((local_a8.ptr)->super_RefCount)._vptr_RefCount[3])();
      }
      if (local_a0 != local_90) {
        operator_delete(local_a0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != paVar2) {
        operator_delete(local_60._M_dataplus._M_p);
      }
      local_60._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"delta","");
      local_a0 = local_90;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,"--delta: print delta numbers in log","");
      pCVar6 = (CommandLineOption *)operator_new(0x38);
      local_80._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char*>((string *)&local_80,local_a0,local_a0 + local_98);
      (pCVar6->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
      (pCVar6->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c45d0;
      (pCVar6->description)._M_dataplus._M_p = (pointer)&(pCVar6->description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pCVar6->description,local_80._M_dataplus._M_p,
                 local_80._M_dataplus._M_p + local_80._M_string_length);
      (pCVar6->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c4f30;
      pCVar6[1].super_RefCount._vptr_RefCount = (_func_int **)this;
      LOCK();
      paVar4 = &(pCVar6->super_RefCount).refCounter;
      (paVar4->super___atomic_base<unsigned_long>)._M_i =
           (paVar4->super___atomic_base<unsigned_long>)._M_i + 1;
      UNLOCK();
      local_a8.ptr = pCVar6;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != paVar3) {
        operator_delete(local_80._M_dataplus._M_p);
      }
      std::
      vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
      ::push_back(&this_01->commandLineOptionList,&local_a8);
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
               ::operator[](this_00,&local_60);
      if (local_a8.ptr != (CommandLineOption *)0x0) {
        (*((local_a8.ptr)->super_RefCount)._vptr_RefCount[2])();
      }
      if (pmVar7->ptr != (CommandLineOption *)0x0) {
        (*(pmVar7->ptr->super_RefCount)._vptr_RefCount[3])();
      }
      pmVar7->ptr = local_a8.ptr;
      if (local_a8.ptr != (CommandLineOption *)0x0) {
        (*((local_a8.ptr)->super_RefCount)._vptr_RefCount[3])();
      }
      if (local_a0 != local_90) {
        operator_delete(local_a0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != paVar2) {
        operator_delete(local_60._M_dataplus._M_p);
      }
      local_60._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"isa","");
      local_a0 = local_90;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,
                 "--isa <string>: selects instruction set to use:\n  sse: select SSE codepath\n  sse2: select SSE2 codepath\n  sse3: select SSE3 codepath\n  ssse3: select SSSE3 codepath\n  sse4.1: select SSE4.1 codepath\n  sse4.2: select SSE4.2 codepath\n  avx: select AVX codepath\n  avxi: select AVXI codepath\n  avx2: select AVX2 codepath\n  avx512: select AVX512 codepath\n"
                 ,"");
      pCVar6 = (CommandLineOption *)operator_new(0x38);
      local_80._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char*>((string *)&local_80,local_a0,local_a0 + local_98);
      (pCVar6->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
      (pCVar6->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c45d0;
      (pCVar6->description)._M_dataplus._M_p = (pointer)&(pCVar6->description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pCVar6->description,local_80._M_dataplus._M_p,
                 local_80._M_dataplus._M_p + local_80._M_string_length);
      (pCVar6->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c4f80;
      pCVar6[1].super_RefCount._vptr_RefCount = (_func_int **)this;
      LOCK();
      paVar4 = &(pCVar6->super_RefCount).refCounter;
      (paVar4->super___atomic_base<unsigned_long>)._M_i =
           (paVar4->super___atomic_base<unsigned_long>)._M_i + 1;
      UNLOCK();
      local_a8.ptr = pCVar6;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != paVar3) {
        operator_delete(local_80._M_dataplus._M_p);
      }
      std::
      vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
      ::push_back(&this_01->commandLineOptionList,&local_a8);
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
               ::operator[](this_00,&local_60);
      if (local_a8.ptr != (CommandLineOption *)0x0) {
        (*((local_a8.ptr)->super_RefCount)._vptr_RefCount[2])();
      }
      if (pmVar7->ptr != (CommandLineOption *)0x0) {
        (*(pmVar7->ptr->super_RefCount)._vptr_RefCount[3])();
      }
      pmVar7->ptr = local_a8.ptr;
      if (local_a8.ptr != (CommandLineOption *)0x0) {
        (*((local_a8.ptr)->super_RefCount)._vptr_RefCount[3])();
      }
      if (local_a0 != local_90) {
        operator_delete(local_a0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != paVar2) {
        operator_delete(local_60._M_dataplus._M_p);
      }
    }
    return;
  }
  this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_02,"internal error: application already created");
  __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Application::Application(int features)
    : rtcore(""), verbosity(0),
      features((Features)features),
      log_delta(false),
      start_time(getSeconds()),
      last_time(start_time),
      last_virtual_memory(0),
      last_resident_memory(0)
  {
    if (instance)
      throw std::runtime_error("internal error: application already created");

    instance = this;

    registerOption("help", [this] (Ref<ParseStream> cin, const FileName& path) {
        printCommandLineHelp();
        exit(1);
      }, "--help: prints help for all supported command line options");

    if (features & FEATURE_RTCORE)
    {
      registerOption("rtcore", [this] (Ref<ParseStream> cin, const FileName& path) {
          rtcore += "," + cin->getString();
        }, "--rtcore <string>: uses <string> to configure Embree device");
    
      registerOption("threads", [this] (Ref<ParseStream> cin, const FileName& path) {
          rtcore += ",threads=" + toString(cin->getInt());
        }, "--threads <int>: number of threads to use");

      registerOption("affinity", [this] (Ref<ParseStream> cin, const FileName& path) {
          rtcore += ",set_affinity=1";
        }, "--affinity: affinitize threads");

      registerOption("set_affinity", [this] (Ref<ParseStream> cin, const FileName& path) {
          rtcore += ",set_affinity=" + cin->getString();
        }, "--set_affinity <0/1>: enables or disables affinitizing of threads");
      registerOptionAlias("set_affinity","set-affinity");

      registerOption("start_threads", [this] (Ref<ParseStream> cin, const FileName& path) {
          rtcore += ",start_threads=" + cin->getString();
        }, "--start_threads <0/1>: starts threads at device creation time if set to 1");
      registerOptionAlias("start_threads","start-threads");
      
      registerOption("verbose", [this] (Ref<ParseStream> cin, const FileName& path) {
          verbosity = cin->getInt();
          rtcore += ",verbose=" + toString(verbosity);
        }, "--verbose <int>: sets verbosity level");

      registerOption("delta", [this] (Ref<ParseStream> cin, const FileName& path) {
          log_delta = true;
        }, "--delta: print delta numbers in log");
      
      registerOption("isa", [this] (Ref<ParseStream> cin, const FileName& path) {
          rtcore += ",isa=" + cin->getString();
        }, "--isa <string>: selects instruction set to use:\n"
        "  sse: select SSE codepath\n"
        "  sse2: select SSE2 codepath\n"
        "  sse3: select SSE3 codepath\n"
        "  ssse3: select SSSE3 codepath\n"
        "  sse4.1: select SSE4.1 codepath\n"
        "  sse4.2: select SSE4.2 codepath\n"
        "  avx: select AVX codepath\n"
        "  avxi: select AVXI codepath\n"
        "  avx2: select AVX2 codepath\n"
        "  avx512: select AVX512 codepath\n");
    } 
  }